

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmloutput.cpp
# Opt level: O0

void __thiscall XmlOutput::newTagOpen(XmlOutput *this,QString *tag)

{
  QTextStream *pQVar1;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  QString *unaff_retaddr;
  XmlOutput *in_stack_00000008;
  QTextStreamFunction in_stack_ffffffffffffffb8;
  XmlOutput *in_stack_ffffffffffffffc0;
  QList<QString> *this_00;
  QList<QString> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  closeOpen(in_stack_ffffffffffffffc0);
  if (*(int *)(in_RDI + 8) == 1) {
    pQVar1 = ::operator<<((QTextStream *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    QTextStream::operator<<(pQVar1,(QString *)(in_RDI + 4));
  }
  pQVar1 = (QTextStream *)QTextStream::operator<<((QTextStream *)*in_RDI,'<');
  this_00 = &local_20;
  doConversion(in_stack_00000008,unaff_retaddr);
  QTextStream::operator<<(pQVar1,(QString *)this_00);
  QString::~QString((QString *)0x2c2246);
  *(undefined4 *)((long)in_RDI + 0x3c) = 2;
  QList<QString>::append(this_00,(parameter_type)pQVar1);
  increaseIndent((XmlOutput *)0x2c226a);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void XmlOutput::newTagOpen(const QString &tag)
{
    Q_ASSERT_X(tag.size(), "XmlOutput", "Cannot open an empty tag");
    closeOpen();

    if (format == NewLine)
        xmlFile << Qt::endl << currentIndent;
    xmlFile << '<' << doConversion(tag);
    currentState = Attribute;
    tagStack.append(tag);
    increaseIndent(); // ---> indent
}